

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNodePtr xmlDocGetRootElement(xmlDoc *doc)

{
  xmlNodePtr pxVar1;
  _xmlNode **pp_Var2;
  
  if (doc != (xmlDoc *)0x0) {
    pp_Var2 = &doc->children;
    while (pxVar1 = *pp_Var2, pxVar1 != (xmlNodePtr)0x0) {
      if (pxVar1->type == XML_ELEMENT_NODE) {
        return pxVar1;
      }
      pp_Var2 = &pxVar1->next;
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlDocGetRootElement(const xmlDoc *doc) {
    xmlNodePtr ret;

    if (doc == NULL) return(NULL);
    ret = doc->children;
    while (ret != NULL) {
	if (ret->type == XML_ELEMENT_NODE)
	    return(ret);
        ret = ret->next;
    }
    return(ret);
}